

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_access<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  pointer puVar3;
  pointer pvVar4;
  Column_zp_settings *pCVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  __hash_code __code;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
  m;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_2b0;
  undefined1 local_298 [8];
  undefined8 local_290;
  shared_count sStack_288;
  char *local_280;
  char *local_278;
  char *local_270;
  _Base_ptr local_268;
  _Base_ptr local_260;
  _Base_ptr local_258;
  char *local_250;
  char *local_248;
  undefined **local_240;
  undefined1 local_238;
  _Base_ptr local_230;
  _Base_ptr local_228;
  Column_zp_settings *local_210;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  local_208;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
            ();
  pCVar5 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>
  ::Column_zp_settings::Column_zp_settings(pCVar5,5);
  local_210 = pCVar5;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>
              *)&local_208,&local_2b0,pCVar5);
  if (local_2b0.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_2b0.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      pvVar4 = local_2b0.
               super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (uint)uVar8;
      if (uVar7 == 5) {
        local_250 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_248 = "";
        local_260 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        local_258 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x255,
                   &local_260);
        if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets
            [uVar8 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0
           ) {
LAB_00200e37:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets
                 [uVar8 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        while (uVar1 != 5) {
          p_Var2 = p_Var2->_M_nxt;
          if ((p_Var2 == (_Hash_node_base *)0x0) ||
             (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
             (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count !=
             uVar8 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count)) goto LAB_00200e37;
        }
        local_298[0] = p_Var2[7]._M_nxt == p_Var2 + 7 || p_Var2[7]._M_nxt == (_Hash_node_base *)0x0;
        local_290 = 0;
        sStack_288.pi_ = (sp_counted_base *)0x0;
        local_270 = "m.get_column(i).is_empty()";
        local_268 = (_Base_ptr)0x21cf32;
        local_238 = _S_red;
        local_240 = &PTR__lazy_ostream_00260fd0;
        local_230 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_228 = (_Base_ptr)&local_270;
        local_280 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_278 = "";
        boost::test_tools::tt_detail::report_assertion
                  (local_298,
                   (_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    *)&local_240,&local_280,0x255,1,0,0);
        boost::detail::shared_count::~shared_count(&sStack_288);
      }
      else {
        if (local_208.reducedMatrixR_.matrix_._M_h._M_buckets
            [uVar8 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count] == (__node_base_ptr)0x0
           ) {
LAB_00200e2b:
          std::__throw_out_of_range("_Map_base::at");
        }
        p_Var2 = local_208.reducedMatrixR_.matrix_._M_h._M_buckets
                 [uVar8 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        while (uVar7 != uVar1) {
          p_Var2 = p_Var2->_M_nxt;
          if ((p_Var2 == (_Hash_node_base *)0x0) ||
             (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
             (ulong)uVar1 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count !=
             uVar8 % local_208.reducedMatrixR_.matrix_._M_h._M_bucket_count)) goto LAB_00200e2b;
        }
        get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
                  ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>
                    *)&local_240,
                   (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
                    *)(p_Var2 + 2));
        test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,true>>>>
                  (pvVar4 + uVar8,
                   (column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>_>
                    *)&local_240);
        std::
        _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&local_240);
      }
      uVar8 = (ulong)(uVar7 + 1);
      uVar6 = ((long)local_2b0.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2b0.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  ::reset(&local_208,local_210);
  pCVar5 = local_210;
  if (local_210 != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)&local_210->entryConstructor);
    puVar3 = (pCVar5->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3,(long)(pCVar5->operators).inverse_.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3)
      ;
    }
  }
  operator_delete(pCVar5,0x58);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_true>_>_>
  ::~RU_matrix(&local_208);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_2b0);
  return;
}

Assistant:

void test_boundary_access() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(orderedBoundaries, 5);

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_RU<Matrix>()) {
      if (i == 5) {
        BOOST_CHECK(m.get_column(i).is_empty());  // reduced
      } else {
        const auto& col = m.get_column(i);  // to force the const version
        test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
      }
    } else {
      const auto& col = m.get_column(i);  // to force the const version
      test_column_equality<typename Matrix::Column>(orderedBoundaries[i], get_column_content_via_iterators(col));
    }
  }
}